

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qssldiffiehellmanparameters.cpp
# Opt level: O2

QSslDiffieHellmanParameters __thiscall
QSslDiffieHellmanParameters::fromEncoded
          (QSslDiffieHellmanParameters *this,QByteArray *encoded,EncodingFormat encoding)

{
  QTlsBackend *pQVar1;
  
  this->d = (QSslDiffieHellmanParametersPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QSslDiffieHellmanParameters(this);
  pQVar1 = QSslSocketPrivate::tlsBackendInUse();
  if (pQVar1 != (QTlsBackend *)0x0) {
    if (encoding == Pem) {
      QSslDiffieHellmanParametersPrivate::initFromPem(this->d,encoded);
    }
    else if (encoding == Der) {
      QSslDiffieHellmanParametersPrivate::initFromDer(this->d,encoded);
    }
  }
  return (QSslDiffieHellmanParameters)(QSslDiffieHellmanParametersPrivate *)this;
}

Assistant:

QSslDiffieHellmanParameters QSslDiffieHellmanParameters::fromEncoded(const QByteArray &encoded, QSsl::EncodingFormat encoding)
{
    QSslDiffieHellmanParameters result;
    const auto *tlsBackend = QSslSocketPrivate::tlsBackendInUse();
    if (!tlsBackend)
        return result;
    switch (encoding) {
    case QSsl::Der:
        result.d->initFromDer(encoded);
        break;
    case QSsl::Pem:
        result.d->initFromPem(encoded);
        break;
    }
    return result;
}